

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtmidi_c.cpp
# Opt level: O0

void rtmidi_error(MidiApi *api,RtMidiErrorType type,char *errorString)

{
  string local_78;
  allocator<char> local_41;
  string local_40 [8];
  string msg;
  char *errorString_local;
  RtMidiErrorType type_local;
  MidiApi *api_local;
  
  msg.field_2._8_8_ = errorString;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,errorString,&local_41);
  std::allocator<char>::~allocator(&local_41);
  std::__cxx11::string::string((string *)&local_78,local_40);
  MidiApi::error(api,type,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void rtmidi_error (MidiApi *api, enum RtMidiErrorType type, const char* errorString)
{
  std::string msg = errorString;
  api->error ((RtMidiError::Type) type, msg);
}